

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lattice.hpp
# Opt level: O2

void __thiscall OpenMD::Lattice::Lattice(Lattice *this)

{
  this->_vptr_Lattice = (_func_int **)&PTR__Lattice_002be330;
  Vector<double,_3U>::Vector(&(this->origin).super_Vector<double,_3U>);
  (this->cellSitesOrt).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cellSitesOrt).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cellSitesPos).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cellSitesOrt).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cellSitesPos).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cellSitesPos).
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Vector<double,_3U>::Vector(&(this->cellLen).super_Vector<double,_3U>);
  Vector<double,_3U>::operator=
            (&(this->origin).super_Vector<double,_3U>,(Vector<double,_3U> *)OpenMD::V3Zero);
  return;
}

Assistant:

Lattice() { setOrigin(V3Zero); }